

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O0

bool __thiscall
MutableTransactionSignatureCreator::CreateSchnorrSig
          (MutableTransactionSignatureCreator *this,SigningProvider *provider,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *sig,XOnlyPubKey *pubkey,
          uint256 *leaf_hash,uint256 *merkle_root,SigVersion sigversion)

{
  long lVar1;
  Span<unsigned_char> sig_00;
  bool bVar2;
  undefined1 uVar3;
  XOnlyPubKey *in_RDI;
  undefined8 *in_R8;
  uint256 *in_R9;
  long in_FS_OFFSET;
  int in_stack_00000008;
  CKey key;
  uint256 hash;
  ScriptExecutionData execdata;
  ScriptExecutionData *in_stack_fffffffffffffe78;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe84;
  Span<unsigned_char> *in_stack_fffffffffffffe88;
  uint256 *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined2 in_stack_fffffffffffffe9c;
  undefined1 in_stack_fffffffffffffe9e;
  undefined1 in_stack_fffffffffffffe9f;
  CMutableTransaction *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  uint256 *hash_out;
  undefined4 in_stack_fffffffffffffeb8;
  uint8_t hash_type;
  undefined4 in_stack_fffffffffffffebc;
  uint32_t in_pos;
  undefined7 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed4 [12];
  bool local_ea;
  uint256 local_d8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_88;
  undefined8 local_87;
  undefined8 local_7f;
  undefined8 local_77;
  undefined8 local_6f;
  undefined1 local_67;
  undefined4 local_64;
  undefined1 local_60;
  undefined1 local_5f;
  PrecomputedTransactionData *in_stack_ffffffffffffffe0;
  MissingDataBehavior in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = in_stack_00000008 == 2 || in_stack_00000008 == 3;
  if (in_stack_00000008 != 2 && in_stack_00000008 != 3) {
    __assert_fail("sigversion == SigVersion::TAPROOT || sigversion == SigVersion::TAPSCRIPT",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/sign.cpp"
                  ,0x40,
                  "virtual bool MutableTransactionSignatureCreator::CreateSchnorrSig(const SigningProvider &, std::vector<unsigned char> &, const XOnlyPubKey &, const uint256 *, const uint256 *, SigVersion) const"
                 );
  }
  hash_out = &local_d8;
  CKey::CKey((CKey *)in_stack_fffffffffffffe78);
  bVar2 = SigningProvider::GetKeyByXOnly
                    ((SigningProvider *)CONCAT17(uVar3,in_stack_fffffffffffffec8),in_RDI,
                     (CKey *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  hash_type = (uint8_t)((uint)in_stack_fffffffffffffeb8 >> 0x18);
  in_pos = CONCAT13(bVar2,(int3)in_stack_fffffffffffffebc);
  if (bVar2) {
    if (((*(long *)(in_RDI[2].m_keydata.super_base_blob<256U>.m_data._M_elems + 8) == 0) ||
        ((*(byte *)(*(long *)(in_RDI[2].m_keydata.super_base_blob<256U>.m_data._M_elems + 8) + 0xa0)
         & 1) == 0)) ||
       ((*(byte *)(*(long *)(in_RDI[2].m_keydata.super_base_blob<256U>.m_data._M_elems + 8) + 0x120)
        & 1) == 0)) {
      local_ea = false;
    }
    else {
      ScriptExecutionData::ScriptExecutionData(in_stack_fffffffffffffe78);
      local_60 = 1;
      local_5f = 0;
      if (in_stack_00000008 == 3) {
        local_67 = 1;
        local_64 = 0xffffffff;
        if (in_R8 == (undefined8 *)0x0) {
          local_ea = false;
          goto LAB_0078b4d4;
        }
        local_88 = 1;
        local_87 = *in_R8;
        local_7f = in_R8[1];
        local_77 = in_R8[2];
        local_6f = in_R8[3];
      }
      uint256::uint256((uint256 *)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe78 =
           *(ScriptExecutionData **)(in_RDI[2].m_keydata.super_base_blob<256U>.m_data._M_elems + 8);
      uVar4 = 1;
      uVar3 = SignatureHashSchnorr<CMutableTransaction>
                        (hash_out,(ScriptExecutionData *)
                                  CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                         in_stack_fffffffffffffea0,in_pos,hash_type,
                         CONCAT13(in_stack_fffffffffffffe9f,
                                  CONCAT12(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c)),
                         in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
      if ((bool)uVar3) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_fffffffffffffe9f,
                            CONCAT16(in_stack_fffffffffffffe9e,
                                     CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)))
                   ,(size_type)in_stack_fffffffffffffe90);
        Span<unsigned_char>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (in_stack_fffffffffffffe88,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffffe84,uVar4),in_stack_fffffffffffffe78);
        local_b8 = 0;
        uStack_b0 = 0;
        local_d8.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        local_d8.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        local_d8.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        local_d8.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        local_d8.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        local_d8.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        local_d8.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        local_d8.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        local_d8.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        local_d8.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        local_d8.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        local_d8.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        local_d8.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        local_d8.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        local_d8.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        local_d8.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        uint256::uint256((uint256 *)in_stack_fffffffffffffe78);
        sig_00._4_12_ = in_stack_fffffffffffffed4;
        sig_00.m_data._0_4_ = in_stack_fffffffffffffed0;
        bVar2 = CKey::SignSchnorr((CKey *)CONCAT17(uVar3,in_stack_fffffffffffffea8),in_R9,sig_00,
                                  (uint256 *)
                                  CONCAT17(in_stack_fffffffffffffe9f,
                                           CONCAT16(in_stack_fffffffffffffe9e,
                                                    CONCAT24(in_stack_fffffffffffffe9c,
                                                             in_stack_fffffffffffffe98))),
                                  in_stack_fffffffffffffe90);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          if (*(int *)((in_RDI->m_keydata).super_base_blob<256U>.m_data._M_elems + 0x14) != 0) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffe78,(value_type_conflict *)0x78b4c0);
          }
          local_ea = true;
        }
        else {
          local_ea = false;
        }
      }
      else {
        local_ea = false;
      }
    }
  }
  else {
    local_ea = false;
  }
LAB_0078b4d4:
  CKey::~CKey((CKey *)in_stack_fffffffffffffe78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_ea;
  }
  __stack_chk_fail();
}

Assistant:

bool MutableTransactionSignatureCreator::CreateSchnorrSig(const SigningProvider& provider, std::vector<unsigned char>& sig, const XOnlyPubKey& pubkey, const uint256* leaf_hash, const uint256* merkle_root, SigVersion sigversion) const
{
    assert(sigversion == SigVersion::TAPROOT || sigversion == SigVersion::TAPSCRIPT);

    CKey key;
    if (!provider.GetKeyByXOnly(pubkey, key)) return false;

    // BIP341/BIP342 signing needs lots of precomputed transaction data. While some
    // (non-SIGHASH_DEFAULT) sighash modes exist that can work with just some subset
    // of data present, for now, only support signing when everything is provided.
    if (!m_txdata || !m_txdata->m_bip341_taproot_ready || !m_txdata->m_spent_outputs_ready) return false;

    ScriptExecutionData execdata;
    execdata.m_annex_init = true;
    execdata.m_annex_present = false; // Only support annex-less signing for now.
    if (sigversion == SigVersion::TAPSCRIPT) {
        execdata.m_codeseparator_pos_init = true;
        execdata.m_codeseparator_pos = 0xFFFFFFFF; // Only support non-OP_CODESEPARATOR BIP342 signing for now.
        if (!leaf_hash) return false; // BIP342 signing needs leaf hash.
        execdata.m_tapleaf_hash_init = true;
        execdata.m_tapleaf_hash = *leaf_hash;
    }
    uint256 hash;
    if (!SignatureHashSchnorr(hash, execdata, m_txto, nIn, nHashType, sigversion, *m_txdata, MissingDataBehavior::FAIL)) return false;
    sig.resize(64);
    // Use uint256{} as aux_rnd for now.
    if (!key.SignSchnorr(hash, sig, merkle_root, {})) return false;
    if (nHashType) sig.push_back(nHashType);
    return true;
}